

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrect.cpp
# Opt level: O3

bool __thiscall QRectF::contains(QRectF *this,QPointF *p)

{
  double dVar1;
  double dVar2;
  byte bVar3;
  double dVar4;
  double dVar5;
  
  dVar1 = this->xp;
  dVar2 = this->w;
  dVar5 = dVar1 + dVar2;
  if ((dVar5 != dVar1) || (NAN(dVar5) || NAN(dVar1))) {
    dVar4 = dVar5;
    if (0.0 <= dVar2) {
      dVar4 = dVar1;
    }
    bVar3 = 0;
    if ((p->xp < dVar4) ||
       ((double)(~-(ulong)(dVar2 < 0.0) & (ulong)dVar5 | (ulong)dVar1 & -(ulong)(dVar2 < 0.0)) <
        p->xp)) goto LAB_00384a05;
    dVar1 = this->yp;
    dVar2 = this->h;
    dVar5 = dVar1 + dVar2;
    if ((dVar5 != dVar1) || (NAN(dVar5) || NAN(dVar1))) {
      dVar4 = dVar5;
      if (0.0 <= dVar2) {
        dVar4 = dVar1;
      }
      bVar3 = -(dVar4 <= p->yp) &
              -(p->yp <= (double)(~-(ulong)(dVar2 < 0.0) & (ulong)dVar5 |
                                 -(ulong)(dVar2 < 0.0) & (ulong)dVar1));
      goto LAB_00384a05;
    }
  }
  bVar3 = 0;
LAB_00384a05:
  return (bool)(bVar3 & 1);
}

Assistant:

bool QRectF::contains(const QPointF &p) const noexcept
{
    qreal l = xp;
    qreal r = xp;
    if (w < 0)
        l += w;
    else
        r += w;
    if (l == r) // null rect
        return false;

    if (p.x() < l || p.x() > r)
        return false;

    qreal t = yp;
    qreal b = yp;
    if (h < 0)
        t += h;
    else
        b += h;
    if (t == b) // null rect
        return false;

    if (p.y() < t || p.y() > b)
        return false;

    return true;
}